

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::TypeOf(SQVM *this,SQObjectPtr *obj1,SQObjectPtr *dest)

{
  long *plVar1;
  SQSharedState *in_RSI;
  SQVM *in_RDI;
  bool bVar2;
  SQObjectPtr closure;
  SQObjectPtr *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  SQString *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  SQSharedState *local_18;
  byte local_1;
  
  if ((((ulong)in_RSI->_metamethods & 0x2000000) != 0) &&
     (*(long *)(*(long *)&(in_RSI->_metamethodsmap).super_SQObject + 0x30) != 0)) {
    in_stack_ffffffffffffffa8 = (SQString *)&stack0xffffffffffffffd0;
    local_18 = in_RSI;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa8);
    plVar1 = *(long **)&(local_18->_metamethodsmap).super_SQObject;
    in_stack_ffffffffffffffb7 =
         (**(code **)(*plVar1 + 0x30))(plVar1,in_RDI,8,in_stack_ffffffffffffffa8);
    bVar2 = (in_stack_ffffffffffffffb7 & 1) != 0;
    if (bVar2) {
      Push((SQVM *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa7 =
           CallMetaMethod(in_RDI,(SQObjectPtr *)
                                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          (SQMetaMethod)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                          CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
      local_1 = in_stack_ffffffffffffffa7;
    }
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2) goto LAB_001440e8;
  }
  GetTypeName((SQObjectPtr *)0x1440c3);
  SQString::Create((SQSharedState *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   (SQChar *)in_stack_ffffffffffffffa8,
                   CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  local_1 = 1;
LAB_001440e8:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::TypeOf(const SQObjectPtr &obj1,SQObjectPtr &dest)
{
    if(is_delegable(obj1) && _delegable(obj1)->_delegate) {
        SQObjectPtr closure;
        if(_delegable(obj1)->GetMetaMethod(this, MT_TYPEOF, closure)) {
            Push(obj1);
            return CallMetaMethod(closure,MT_TYPEOF,1,dest);
        }
    }
    dest = SQString::Create(_ss(this),GetTypeName(obj1));
    return true;
}